

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

char fsnav_step(void)

{
  size_t *psVar1;
  fsnav_plugin *pfVar2;
  ulong uVar3;
  fsnav_struct *pfVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  pfVar4 = fsnav;
  (fsnav->core).current_plugin_id = 0;
  if ((pfVar4->core).plugin_count != 0) {
    uVar6 = 0;
    do {
      if ((pfVar4->mode < 1) ||
         ((pfVar2 = (pfVar4->core).plugins, 0 < pfVar2[uVar6].cycle &&
          (pfVar2[uVar6].tick == pfVar2[uVar6].shift)))) {
        (*(pfVar4->core).plugins[uVar6].func)();
      }
      pfVar4 = fsnav;
      pfVar2 = (fsnav->core).plugins;
      iVar5 = pfVar2[uVar6].tick + 1;
      pfVar2[uVar6].tick = iVar5;
      if (pfVar2[uVar6].cycle <= iVar5) {
        pfVar2[uVar6].tick = 0;
      }
      uVar3 = (pfVar4->core).exit_plugin_id;
      if (uVar3 == uVar6) {
        (pfVar4->core).exit_plugin_id = 0xffffffff;
        (pfVar4->core).host_termination = '\0';
        fsnav_free();
        break;
      }
      if (pfVar4->mode < 0) {
        if (uVar3 == 0xffffffff) goto LAB_001078fe;
      }
      else if ((uVar3 == 0xffffffff) && ((pfVar4->core).host_termination == '\x01')) {
LAB_001078fe:
        if (0 < pfVar4->mode) {
          pfVar4->mode = -1;
        }
        if (pfVar4->mode != 0) {
          (pfVar4->core).exit_plugin_id = uVar6;
        }
      }
      psVar1 = &(pfVar4->core).current_plugin_id;
      *psVar1 = *psVar1 + 1;
      uVar6 = (fsnav->core).current_plugin_id;
      pfVar4 = fsnav;
    } while (uVar6 < (fsnav->core).plugin_count);
  }
  pfVar4 = fsnav;
  if (fsnav->mode == 0) {
    fsnav->mode = 1;
  }
  bVar7 = true;
  if (pfVar4->mode < 0) {
    bVar7 = (pfVar4->core).exit_plugin_id < 0xffffffff;
  }
  return bVar7;
}

Assistant:

char fsnav_step(void)
{
	size_t i;

	// loop through plugin execution list
	for (fsnav->core.current_plugin_id = 0; fsnav->core.current_plugin_id < fsnav->core.plugin_count; fsnav->core.current_plugin_id++) {
		i = fsnav->core.current_plugin_id;

		if (fsnav->mode <= 0                                                                                    // init/termination mode
			|| (fsnav->core.plugins[i].cycle > 0 && fsnav->core.plugins[i].tick == fsnav->core.plugins[i].shift)) // or the scheduled tick has come
			fsnav->core.plugins[i].func();                                                                      // execute the current plugin

		fsnav->core.plugins[i].tick++;                                  // current tick increment
		if (fsnav->core.plugins[i].tick >= fsnav->core.plugins[i].cycle) // check to stay within the cycle
			fsnav->core.plugins[i].tick = 0;                            // reset tick

		if (fsnav->core.exit_plugin_id == i)	{     // if termination was initiated by the current plugin on the previous loop
			fsnav->core.exit_plugin_id = UINT_MAX; // set to default
			fsnav->core.host_termination = 0;      // set to default
			fsnav_free();                          // free memory
			break;
		}

		if ((fsnav->mode < 0 || fsnav->core.host_termination == 1) && fsnav->core.exit_plugin_id == UINT_MAX) { // if termination was initiated by the current plugin on the current loop
			if (fsnav->mode > 0)
				fsnav->mode = -1;               // set mode to -1 for external termination cases

			if (fsnav->mode != 0)
				fsnav->core.exit_plugin_id = i; // set the index to use in the next loop
		}
	}

	if (fsnav->mode == 0) // if initialization ended
		fsnav->mode = 1;  // set operation mode to regular operation

	// success if either staying in regular operation mode, or a termination properly detected
	return (fsnav->mode >= 0) || (fsnav->core.exit_plugin_id < UINT_MAX);
}